

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Evaluator.cpp
# Opt level: O2

Object * punky::eval::Evaluator::eval_minus_prefix_expr
                   (Object *__return_storage_ptr__,Object *right)

{
  variant_alternative_t<1UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
  *pvVar1;
  ObjectType *in_RDX;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (right->m_type == Int) {
    __return_storage_ptr__->m_type = Int;
    pvVar1 = std::
             get<1ul,std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                       (&right->m_value);
    *(variant_alternative_t<1UL,_variant<monostate,_int,_bool,_any,_basic_string<char>,_FunctionObject>_>
      *)&(__return_storage_ptr__->m_value).
         super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
         .
         super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         .
         super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
         ._M_u = -*pvVar1;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_value).
             super__Variant_base<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::obj::FunctionObject>
             .
             super__Move_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
             .
             super__Copy_assign_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
             .
             super__Move_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
             .
             super__Copy_ctor_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
             .
             super__Variant_storage_alias<std::monostate,_int,_bool,_std::any,_std::__cxx11::basic_string<char>,_punky::obj::FunctionObject>
     + 0x20) = '\x01';
  }
  else {
    __return_storage_ptr__->m_type = Error;
    obj::type_to_string_abi_cxx11_(&local_50,(obj *)right,in_RDX);
    std::operator+(&local_30,"unknown operator: -",&local_50);
    std::variant<std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>::
    variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
              ((variant<std::monostate,int,bool,std::any,std::__cxx11::string,punky::obj::FunctionObject>
                *)&__return_storage_ptr__->m_value,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Object Evaluator::eval_minus_prefix_expr(const Object& right)
{
    if (right.m_type == ObjectType::Int)
        return Object{ObjectType::Int, -std::get<int>(right.m_value)};

    return unknown_op_error(right);
}